

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O2

bool __thiscall BeliefSparse::SanityCheck(BeliefSparse *this)

{
  double dVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  BScit it;
  double local_38;
  undefined1 local_30 [24];
  size_type local_18;
  
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::begin((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)local_30);
  local_38 = 0.0;
  while (boost::numeric::ublas::
         compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
         ::end((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)(local_30 + 0x10)), local_30._8_8_ != local_18) {
    dVar1 = *(double *)
             (*(long *)(local_30._0_8_ + 0x40) + (local_30._8_8_ - *(long *)(local_30._0_8_ + 0x28))
             );
    if ((dVar1 < 0.0) || (1.000000000001 < dVar1)) goto LAB_0045c281;
    local_30._8_8_ = local_30._8_8_ + 8;
    local_38 = local_38 + dVar1;
  }
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_38 + -1.0;
  auVar3 = vandpd_avx512vl(auVar4,auVar3);
  if (auVar3._0_8_ <= 1e-12) {
    bVar2 = (this->_m_b).size_ != 0;
  }
  else {
LAB_0045c281:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool BeliefSparse::SanityCheck() const
{
    // check for negative and entries>1
    double sum=0;
    for(BScit it=_m_b.begin();
        it!=_m_b.end(); ++it)
    {
        if(*it<0)
            return(false);
        if(*it>1 + PROB_PRECISION)
            return(false);
        if(std::isnan(*it))
            return(false);
        sum+=*it;
    }

    // check if sums to 1
    if(abs(sum-1)>PROB_PRECISION)
        return(false);

    // check whether the size is not zero
    if(_m_b.size()==0)
        return(false);

    // if we haven't returned yet, the belief is fine
    return(true);
}